

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
GetScriptBufferDetails
          (JsValueRef scriptVal,JsParseScriptAttributes parseAttributes,LoadScriptFlag *scriptFlag,
          size_t *cb,byte **script)

{
  bool bVar1;
  bool bVar2;
  uint local_4c;
  byte *local_48;
  bool local_3c;
  bool isUtf8;
  bool isString;
  bool isExternalArray;
  byte **script_local;
  size_t *cb_local;
  LoadScriptFlag *scriptFlag_local;
  JsParseScriptAttributes parseAttributes_local;
  JsValueRef scriptVal_local;
  
  if (scriptFlag == (LoadScriptFlag *)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else if (cb == (size_t *)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else if (script == (byte **)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *scriptFlag = LoadScriptFlag_None;
    *cb = 0;
    *script = (byte *)0x0;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    local_3c = false;
    if ((bVar1) || (local_3c = Js::VarIs<Js::JavascriptString>(scriptVal), local_3c)) {
      bVar2 = (parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) !=
              JsParseScriptAttributeNone;
      if (bVar1) {
        local_48 = (byte *)(**(code **)(*scriptVal + 0x390))();
      }
      else {
        local_48 = (byte *)(**(code **)(*scriptVal + 0x328))();
      }
      *script = local_48;
      if (bVar1) {
        local_4c = (**(code **)(*scriptVal + 0x388))();
      }
      else {
        local_4c = Js::JavascriptString::GetSizeInBytes((JavascriptString *)scriptVal);
      }
      *cb = (ulong)local_4c;
      if ((!bVar1) || (local_3c != false || bVar2)) {
        if (local_3c != false || bVar2) {
          *scriptFlag = LoadScriptFlag_None;
        }
        else {
          *scriptFlag = LoadScriptFlag_Utf8Source;
        }
      }
      else {
        *scriptFlag = LoadScriptFlag_ExternalArrayBuffer|LoadScriptFlag_Utf8Source;
      }
      scriptVal_local._4_4_ = JsNoError;
    }
    else {
      scriptVal_local._4_4_ = JsErrorInvalidArgument;
    }
  }
  return scriptVal_local._4_4_;
}

Assistant:

JsErrorCode GetScriptBufferDetails(
    _In_ JsValueRef scriptVal,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ LoadScriptFlag* scriptFlag,
    _Out_ size_t* cb,
    _Out_ const byte** script)
{
    PARAM_NOT_NULL(scriptFlag);
    PARAM_NOT_NULL(cb);
    PARAM_NOT_NULL(script);

    *scriptFlag = LoadScriptFlag_None;
    *cb = 0;
    *script = nullptr;

    const bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    const bool isString = !isExternalArray && Js::VarIs<Js::JavascriptString>(scriptVal);
    if (!isExternalArray && !isString)
    {
        return JsErrorInvalidArgument;
    }
    const bool isUtf8 = !isString && !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

    *script = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer() :
        (const byte*)((Js::JavascriptString*)(scriptVal))->GetSz();
    *cb = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength() :
        ((Js::JavascriptString*)(scriptVal))->GetSizeInBytes();

    if (isExternalArray && isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_ExternalArrayBuffer | LoadScriptFlag_Utf8Source);
    }
    else if (isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_Utf8Source);
    }
    else
    {
        *scriptFlag = LoadScriptFlag_None;
    }

    return JsNoError;
}